

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

void __thiscall
CppGenerator::registerAggregatesToVariables
          (CppGenerator *this,Aggregate *aggregate,size_t group_id,size_t view_id,size_t agg_id,
          size_t depth,
          vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          *localAggReg)

{
  ulong uVar1;
  bool bVar2;
  bitset<1500UL> *pbVar3;
  ostream *poVar4;
  size_t sVar5;
  reference pvVar6;
  pointer ppVar7;
  reference this_00;
  reference pvVar8;
  size_type sVar9;
  size_type sVar10;
  size_type sVar11;
  pointer ppVar12;
  reference this_01;
  mapped_type *pmVar13;
  AggregateTuple *pAVar14;
  reference pvVar15;
  AggregateTuple *pAVar16;
  size_t in_RCX;
  Aggregate *in_RDX;
  CppGenerator *in_RSI;
  long in_RDI;
  value_type *__x;
  size_t in_R8;
  size_type in_R9;
  reference rVar17;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *unaff_retaddr;
  key_type *in_stack_00000008;
  AggregateTuple aggComputation;
  ProductAggregate prodAgg_1;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *dependentViewReg;
  prod_bitset *dependentFunctions;
  size_t prodID_2;
  size_t postProdID;
  iterator postit;
  PostAggRegTuple postTuple;
  size_t prodID_1;
  size_t i;
  size_t newProdID;
  iterator prod_it;
  ProductAggregate prodAgg;
  View *incView_1;
  size_t *incViewID_1;
  size_t n;
  var_bitset *otherFVars;
  Function *otherFunction;
  size_t f2;
  prod_bitset overlapFunc;
  var_bitset overlapVars;
  bool computeHere;
  bool overlaps;
  size_t var_1;
  var_bitset dependentFunctionVars;
  Function *function;
  size_t f;
  prod_bitset *product;
  size_t prodID;
  size_t incCounter;
  View *incView;
  size_t *incViewID;
  iterator __end4;
  iterator __begin4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range4;
  size_t var;
  var_bitset nonVarOrder;
  var_bitset dependentVariables;
  prod_bitset considered;
  prod_bitset localFunctions;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  viewReg;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  localComputation;
  dyn_bitset loopFactors;
  size_t numberIncomingViews;
  size_t numLocalProducts;
  var_bitset *varOrderBitset;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *varOrder;
  var_bitset *relationBag;
  TDNode *node;
  View *view;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *incoming;
  key_type *in_stack_fffffffffffff148;
  TreeDecomposition *in_stack_fffffffffffff150;
  value_type *in_stack_fffffffffffff158;
  AggregateTuple *in_stack_fffffffffffff160;
  size_type in_stack_fffffffffffff168;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff170;
  pointer in_stack_fffffffffffff1e8;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *in_stack_fffffffffffff1f0;
  bool local_df1;
  bitset<1500UL> *in_stack_fffffffffffff210;
  bool local_dda;
  bool local_dd9;
  byte local_d71;
  byte local_d59;
  byte local_d2a;
  size_t local_cd8;
  int local_cc4;
  size_type local_cc0;
  pair<unsigned_long,_unsigned_long> local_cb8 [2];
  pair<unsigned_long,_unsigned_long> local_c98;
  pair<unsigned_long,_unsigned_long> local_c88 [17];
  undefined1 local_b78;
  int local_a6c;
  size_type local_a68;
  pair<unsigned_long,_unsigned_long> local_a60;
  undefined1 local_a50 [216];
  pair<unsigned_long,_unsigned_long> local_978 [2];
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *local_950;
  reference local_948;
  size_type local_940;
  pair<unsigned_long,_unsigned_long> local_938;
  size_type local_928;
  pair<unsigned_long,_unsigned_long> local_920;
  _Node_iterator_base<std::pair<const_PostAggRegTuple,_unsigned_long>,_true> local_910;
  _Node_iterator_base<std::pair<const_PostAggRegTuple,_unsigned_long>,_true> local_908;
  pair<unsigned_long,_unsigned_long> local_900;
  pair<unsigned_long,_unsigned_long> local_8f0;
  size_type local_8e0;
  int local_8d4;
  size_type local_8d0;
  pair<unsigned_long,_unsigned_long> local_8c8;
  ulong local_8b8;
  pair<unsigned_long,_unsigned_long> local_8b0;
  pointer local_8a0;
  pair<unsigned_long,_unsigned_long> local_898;
  _Node_iterator_base<std::pair<const_ProductAggregate,_unsigned_long>,_true> local_888;
  _Node_iterator_base<std::pair<const_ProductAggregate,_unsigned_long>,_true> local_880;
  _Base_bitset<2UL> local_878;
  _Base_bitset<2UL> local_868;
  int local_854;
  size_type local_850;
  pair<unsigned_long,_unsigned_long> local_848;
  undefined1 local_838 [216];
  pair<unsigned_long,_unsigned_long> local_760 [2];
  undefined1 local_740;
  _Base_bitset<2UL> local_738;
  _Base_bitset<2UL> local_728;
  _Base_bitset<2UL> local_718;
  _Base_bitset<2UL> local_708;
  _Base_bitset<2UL> local_6f8;
  View *local_6e8;
  reference local_6e0;
  reference local_6d0;
  ulong local_6c8;
  _Base_bitset<2UL> local_600;
  _Base_bitset<2UL> local_5f0;
  _Base_bitset<2UL> local_5e0;
  _Base_bitset<2UL> local_5d0;
  _Base_bitset<2UL> local_5c0;
  Function *local_5b0;
  Function *local_5a8;
  byte local_599;
  reference local_598;
  byte local_581;
  reference local_580;
  reference local_570;
  ulong local_560;
  undefined1 local_498 [214];
  byte local_3c2;
  byte local_3c1;
  _Base_bitset<2UL> local_3c0;
  reference local_3b0;
  ulong local_3a0;
  _Base_bitset<2UL> local_388;
  Function *local_378;
  byte local_369;
  reference local_368;
  ulong local_358;
  reference local_350;
  ulong local_348;
  size_type local_340;
  _Base_bitset<2UL> local_338;
  _Base_bitset<2UL> local_328;
  reference local_318;
  View *local_308;
  reference local_300;
  unsigned_long *local_2f8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_2f0;
  long local_2e8;
  _Base_bitset<2UL> local_2e0;
  _Base_bitset<2UL> local_2d0;
  reference local_2c0;
  ulong local_2b0;
  _Base_bitset<2UL> local_2a8;
  _Base_bitset<2UL> local_298;
  undefined1 local_1b8 [220];
  int local_dc;
  size_type local_d8;
  pair<unsigned_long,_unsigned_long> local_d0;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_c0 [3];
  size_t local_70;
  size_type local_68;
  reference local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_58;
  bitset<100UL> *local_50;
  TDNode *local_48;
  View *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *this_02;
  
  this_02 = &(in_RSI->_pathToData).field_2;
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2b4ebc);
  local_40 = QueryCompiler::getView
                       ((QueryCompiler *)in_stack_fffffffffffff150,(size_t)in_stack_fffffffffffff148
                       );
  std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2b4ee5);
  local_48 = TreeDecomposition::getRelation
                       (in_stack_fffffffffffff150,(size_t)in_stack_fffffffffffff148);
  local_50 = &local_48->_bag;
  local_58 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             (*(long *)(in_RDI + 0xb8) + (long)in_RDX * 0x18);
  local_60 = std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::operator[]
                       ((vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_> *)
                        (in_RDI + 0xd0),(size_type)in_RDX);
  local_68 = std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::size
                       ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)in_RSI
                       );
  if (local_40->_origin == local_40->_destination) {
    local_cd8 = local_48->_numOfNeighbors;
  }
  else {
    local_cd8 = local_48->_numOfNeighbors - 1;
  }
  local_70 = local_cd8;
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2b4fd1);
  QueryCompiler::numberOfViews((QueryCompiler *)0x2b4fd9);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x2b4ff9);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (in_stack_fffffffffffff170,in_stack_fffffffffffff168,
             (unsigned_long)in_stack_fffffffffffff160,
             (allocator<unsigned_long> *)in_stack_fffffffffffff158);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x2b5029);
  local_d8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_58);
  local_dc = 0;
  std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_int,_true>
            (&local_d0,&local_d8,&local_dc);
  std::allocator<std::pair<unsigned_long,_unsigned_long>_>::allocator
            ((allocator<std::pair<unsigned_long,_unsigned_long>_> *)0x2b508d);
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            *)in_stack_fffffffffffff170,in_stack_fffffffffffff168,
           (value_type *)in_stack_fffffffffffff160,(allocator_type *)in_stack_fffffffffffff158);
  std::allocator<std::pair<unsigned_long,_unsigned_long>_>::~allocator
            ((allocator<std::pair<unsigned_long,_unsigned_long>_> *)0x2b50c1);
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            *)0x2b50ce);
  std::bitset<1500UL>::bitset((bitset<1500UL> *)0x2b50db);
  std::bitset<1500UL>::bitset((bitset<1500UL> *)0x2b50e8);
  std::bitset<100UL>::bitset((bitset<100UL> *)0x2b50f5);
  local_2a8._M_w =
       (_WordT  [2])std::bitset<100UL>::operator~((bitset<100UL> *)in_stack_fffffffffffff158);
  local_298._M_w =
       (_WordT  [2])
       std::operator&((bitset<100UL> *)in_stack_fffffffffffff148,(bitset<100UL> *)0x2b513b);
  for (local_2b0 = 0; local_2b0 < 100; local_2b0 = local_2b0 + 1) {
    std::bitset<100UL>::operator[]
              ((bitset<100UL> *)in_stack_fffffffffffff158,(size_t)in_stack_fffffffffffff150);
    bVar2 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffff150);
    std::bitset<100UL>::reference::~reference(&local_2c0);
    if (bVar2) {
      bVar2 = std::bitset<100UL>::operator[]
                        ((bitset<100UL> *)in_stack_fffffffffffff150,
                         (size_t)in_stack_fffffffffffff148);
      if (bVar2) {
        local_2e0._M_w =
             (_WordT  [2])std::bitset<100UL>::operator~((bitset<100UL> *)in_stack_fffffffffffff158);
        local_2d0._M_w =
             (_WordT  [2])
             std::operator&((bitset<100UL> *)in_stack_fffffffffffff148,(bitset<100UL> *)0x2b5226);
        std::bitset<100UL>::operator|=
                  ((bitset<100UL> *)in_stack_fffffffffffff150,
                   (bitset<100UL> *)in_stack_fffffffffffff148);
      }
      else {
        local_2e8 = *(long *)(in_RDI + 0xa8) + in_RCX * 0x18;
        local_2f0._M_current =
             (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffff148);
        local_2f8 = (unsigned_long *)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_fffffffffffff148);
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                   *)in_stack_fffffffffffff150,
                                  (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                   *)in_stack_fffffffffffff148), bVar2) {
          local_300 = __gnu_cxx::
                      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ::operator*(&local_2f0);
          std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                     )0x2b535f);
          local_308 = QueryCompiler::getView
                                ((QueryCompiler *)in_stack_fffffffffffff150,
                                 (size_t)in_stack_fffffffffffff148);
          std::bitset<100UL>::operator[]
                    ((bitset<100UL> *)in_stack_fffffffffffff158,(size_t)in_stack_fffffffffffff150);
          bVar2 = std::bitset::reference::operator_cast_to_bool
                            ((reference *)in_stack_fffffffffffff150);
          std::bitset<100UL>::reference::~reference(&local_318);
          if (bVar2) {
            local_338._M_w =
                 (_WordT  [2])
                 std::bitset<100UL>::operator~((bitset<100UL> *)in_stack_fffffffffffff158);
            local_328._M_w =
                 (_WordT  [2])
                 std::operator&((bitset<100UL> *)in_stack_fffffffffffff148,(bitset<100UL> *)0x2b5423
                               );
            std::bitset<100UL>::operator|=
                      ((bitset<100UL> *)in_stack_fffffffffffff150,
                       (bitset<100UL> *)in_stack_fffffffffffff148);
          }
          __gnu_cxx::
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator++(&local_2f0);
        }
      }
    }
  }
  local_340 = 0;
  for (local_348 = 0; local_348 < local_68; local_348 = local_348 + 1) {
    local_350 = std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[]
                          ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                           in_RSI,local_348);
    std::bitset<1500UL>::reset((bitset<1500UL> *)in_stack_fffffffffffff150);
    std::bitset<1500UL>::reset((bitset<1500UL> *)in_stack_fffffffffffff150);
    for (local_358 = 0; local_358 < 0x5dc; local_358 = local_358 + 1) {
      local_369 = 0;
      bVar2 = std::bitset<1500UL>::test
                        ((bitset<1500UL> *)in_stack_fffffffffffff150,
                         (size_t)in_stack_fffffffffffff148);
      local_d2a = 0;
      if (bVar2) {
        std::bitset<1500UL>::operator[]
                  (&in_stack_fffffffffffff158->product,(size_t)in_stack_fffffffffffff150);
        local_369 = 1;
        bVar2 = std::bitset::reference::operator_cast_to_bool
                          ((reference *)in_stack_fffffffffffff150);
        local_d2a = bVar2 ^ 0xff;
      }
      if ((local_369 & 1) != 0) {
        std::bitset<1500UL>::reference::~reference(&local_368);
      }
      if ((local_d2a & 1) != 0) {
        std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x2b55c0);
        local_378 = QueryCompiler::getFunction
                              ((QueryCompiler *)in_stack_fffffffffffff150,
                               (size_t)in_stack_fffffffffffff148);
        std::bitset<1500UL>::set
                  ((bitset<1500UL> *)in_stack_fffffffffffff160,(size_t)in_stack_fffffffffffff158,
                   SUB81((ulong)in_stack_fffffffffffff150 >> 0x38,0));
        std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::operator[]
                  ((vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_> *)
                   (in_RDI + 0x2b0),in_R9);
        local_388._M_w =
             (_WordT  [2])
             std::operator&((bitset<100UL> *)in_stack_fffffffffffff148,(bitset<100UL> *)0x2b5642);
        bVar2 = std::bitset<100UL>::operator==
                          ((bitset<100UL> *)in_stack_fffffffffffff150,
                           (bitset<100UL> *)in_stack_fffffffffffff148);
        if (bVar2) {
          std::bitset<100UL>::bitset((bitset<100UL> *)0x2b567d);
          for (local_3a0 = 0; local_3a0 < 100; local_3a0 = local_3a0 + 1) {
            std::bitset<100UL>::operator[]
                      ((bitset<100UL> *)in_stack_fffffffffffff158,(size_t)in_stack_fffffffffffff150)
            ;
            bVar2 = std::bitset::reference::operator_cast_to_bool
                              ((reference *)in_stack_fffffffffffff150);
            std::bitset<100UL>::reference::~reference(&local_3b0);
            if (bVar2) {
              std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::operator[]
                        ((vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_> *)
                         (in_RDI + 0x298),local_3a0);
              std::bitset<100UL>::operator|=
                        ((bitset<100UL> *)in_stack_fffffffffffff150,
                         (bitset<100UL> *)in_stack_fffffffffffff148);
            }
          }
          local_3c0._M_w =
               (_WordT  [2])
               std::bitset<100UL>::operator~((bitset<100UL> *)in_stack_fffffffffffff158);
          std::bitset<100UL>::operator&=
                    ((bitset<100UL> *)in_stack_fffffffffffff150,
                     (bitset<100UL> *)in_stack_fffffffffffff148);
          std::bitset<100UL>::bitset((bitset<100UL> *)0x2b576b);
          std::bitset<1500UL>::bitset((bitset<1500UL> *)0x2b5780);
          pbVar3 = std::bitset<1500UL>::set
                             ((bitset<1500UL> *)in_stack_fffffffffffff160,
                              (size_t)in_stack_fffffffffffff158,
                              SUB81((ulong)in_stack_fffffffffffff150 >> 0x38,0));
          memcpy(local_498,pbVar3,0xc0);
          do {
            local_3c1 = 0;
            local_3c2 = 1;
            std::bitset<100UL>::operator|=
                      ((bitset<100UL> *)in_stack_fffffffffffff150,
                       (bitset<100UL> *)in_stack_fffffffffffff148);
            for (local_560 = 0; local_560 < 0x5dc; local_560 = local_560 + 1) {
              local_581 = 0;
              local_599 = 0;
              std::bitset<1500UL>::operator[]
                        (&in_stack_fffffffffffff158->product,(size_t)in_stack_fffffffffffff150);
              bVar2 = std::bitset::reference::operator_cast_to_bool
                                ((reference *)in_stack_fffffffffffff150);
              local_d59 = 0;
              if (bVar2) {
                std::bitset<1500UL>::operator[]
                          (&in_stack_fffffffffffff158->product,(size_t)in_stack_fffffffffffff150);
                local_581 = 1;
                bVar2 = std::bitset::reference::operator_cast_to_bool
                                  ((reference *)in_stack_fffffffffffff150);
                local_d59 = 0;
                if (!bVar2) {
                  std::bitset<1500UL>::operator[]
                            (&in_stack_fffffffffffff158->product,(size_t)in_stack_fffffffffffff150);
                  local_599 = 1;
                  bVar2 = std::bitset::reference::operator_cast_to_bool
                                    ((reference *)in_stack_fffffffffffff150);
                  local_d59 = bVar2 ^ 0xff;
                }
              }
              if ((local_599 & 1) != 0) {
                std::bitset<1500UL>::reference::~reference(&local_598);
              }
              if ((local_581 & 1) != 0) {
                std::bitset<1500UL>::reference::~reference(&local_580);
              }
              std::bitset<1500UL>::reference::~reference(&local_570);
              if ((local_d59 & 1) != 0) {
                std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2b5941);
                local_5b0 = QueryCompiler::getFunction
                                      ((QueryCompiler *)in_stack_fffffffffffff150,
                                       (size_t)in_stack_fffffffffffff148);
                local_5a8 = local_5b0;
                local_5c0._M_w =
                     (_WordT  [2])
                     std::operator&((bitset<100UL> *)in_stack_fffffffffffff148,
                                    (bitset<100UL> *)0x2b5990);
                bVar2 = std::bitset<100UL>::any((bitset<100UL> *)0x2b59ad);
                if (bVar2) {
                  std::bitset<1500UL>::set
                            ((bitset<1500UL> *)in_stack_fffffffffffff160,
                             (size_t)in_stack_fffffffffffff158,
                             SUB81((ulong)in_stack_fffffffffffff150 >> 0x38,0));
                  std::bitset<1500UL>::set
                            ((bitset<1500UL> *)in_stack_fffffffffffff160,
                             (size_t)in_stack_fffffffffffff158,
                             SUB81((ulong)in_stack_fffffffffffff150 >> 0x38,0));
                  local_3c1 = 1;
                  std::bitset<100UL>::operator|=
                            ((bitset<100UL> *)in_stack_fffffffffffff150,
                             (bitset<100UL> *)in_stack_fffffffffffff148);
                  std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::operator[]
                            ((vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_> *)
                             (in_RDI + 0x2b0),in_R9);
                  local_5d0._M_w =
                       (_WordT  [2])
                       std::operator&((bitset<100UL> *)in_stack_fffffffffffff148,
                                      (bitset<100UL> *)0x2b5a47);
                  bVar2 = std::bitset<100UL>::operator!=
                                    ((bitset<100UL> *)in_stack_fffffffffffff150,
                                     (bitset<100UL> *)in_stack_fffffffffffff148);
                  if (bVar2) {
                    local_3c2 = 0;
                  }
                }
              }
            }
            local_d71 = 0;
            if ((local_3c1 & 1) != 0) {
              local_d71 = local_3c2 ^ 0xff;
            }
          } while ((local_d71 & 1) != 0);
          if ((local_3c2 & 1) != 0) {
            local_600._M_w =
                 (_WordT  [2])
                 std::bitset<100UL>::operator~((bitset<100UL> *)in_stack_fffffffffffff158);
            local_5f0._M_w =
                 (_WordT  [2])
                 std::operator&((bitset<100UL> *)in_stack_fffffffffffff148,(bitset<100UL> *)0x2b5b66
                               );
            local_5e0._M_w =
                 (_WordT  [2])
                 std::operator&((bitset<100UL> *)in_stack_fffffffffffff148,(bitset<100UL> *)0x2b5b8b
                               );
            bVar2 = std::bitset<100UL>::any((bitset<100UL> *)0x2b5ba8);
            if (bVar2) {
              if (*(size_type *)(*(long *)(in_RDI + 0xb0) + in_RCX * 8) != in_R9) {
                poVar4 = std::operator<<((ostream *)&std::cerr,
                                         "ERROR ERROR: in dependent computation:");
                std::operator<<(poVar4," viewLevelRegister[viewID] != depth\n");
              }
              std::vector<DependentComputation,_std::allocator<DependentComputation>_>::operator[]
                        ((vector<DependentComputation,_std::allocator<DependentComputation>_> *)
                         (in_RDI + 0x538),local_348);
              std::bitset<1500UL>::operator|=
                        ((bitset<1500UL> *)in_stack_fffffffffffff150,
                         &in_stack_fffffffffffff148->product);
            }
            else {
              std::bitset<1500UL>::operator|=
                        ((bitset<1500UL> *)in_stack_fffffffffffff150,
                         &in_stack_fffffffffffff148->product);
            }
            std::bitset<1500UL>::operator~(in_stack_fffffffffffff210);
            std::bitset<1500UL>::operator&=
                      ((bitset<1500UL> *)in_stack_fffffffffffff150,
                       &in_stack_fffffffffffff148->product);
          }
        }
      }
    }
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::clear((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             *)0x2b5ca4);
    for (local_6c8 = 0; local_6c8 < local_70; local_6c8 = local_6c8 + 1) {
      local_6d0 = std::
                  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ::operator[]((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                *)this_02,local_340);
      std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x2b5d28);
      QueryCompiler::numberOfViews((QueryCompiler *)0x2b5d30);
      rVar17 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffff160,(size_type)in_stack_fffffffffffff158);
      local_6e0 = rVar17;
      bVar2 = boost::dynamic_bitset::reference::operator_cast_to_bool((reference *)&local_6e0);
      if (bVar2) {
        std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x2b5dd2);
        local_6e8 = QueryCompiler::getView
                              ((QueryCompiler *)in_stack_fffffffffffff150,
                               (size_t)in_stack_fffffffffffff148);
        local_718._M_w =
             (_WordT  [2])std::bitset<100UL>::operator~((bitset<100UL> *)in_stack_fffffffffffff158);
        local_708._M_w =
             (_WordT  [2])
             std::operator&((bitset<100UL> *)in_stack_fffffffffffff148,(bitset<100UL> *)0x2b5e45);
        local_6f8._M_w =
             (_WordT  [2])
             std::operator&((bitset<100UL> *)in_stack_fffffffffffff148,(bitset<100UL> *)0x2b5e6e);
        bVar2 = std::bitset<100UL>::none((bitset<100UL> *)0x2b5e8b);
        if (bVar2) {
          std::
          vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ::operator[]((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        *)this_02,local_340);
          std::
          vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ::push_back((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       *)in_stack_fffffffffffff160,(value_type *)in_stack_fffffffffffff158);
        }
        else {
          std::vector<DependentComputation,_std::allocator<DependentComputation>_>::operator[]
                    ((vector<DependentComputation,_std::allocator<DependentComputation>_> *)
                     (in_RDI + 0x538),local_348);
          std::
          vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ::operator[]((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        *)this_02,local_340);
          std::
          vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ::push_back((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       *)in_stack_fffffffffffff160,(value_type *)in_stack_fffffffffffff158);
        }
        std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x2b5f1e);
        sVar5 = QueryCompiler::numberOfViews((QueryCompiler *)0x2b5f26);
        pvVar6 = std::
                 vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ::operator[]((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                               *)this_02,local_340);
        pvVar6->first = sVar5;
      }
      local_340 = local_340 + 1;
    }
    bVar2 = std::bitset<1500UL>::any((bitset<1500UL> *)0x2b5f8a);
    local_dd9 = true;
    if (!bVar2) {
      bVar2 = std::
              vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ::empty((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       *)in_stack_fffffffffffff160);
      local_dd9 = true;
      if (bVar2) {
        sVar9 = in_R9 + 1;
        sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_58);
        local_dda = false;
        if (sVar9 == sVar10) {
          local_738._M_w =
               (_WordT  [2])
               std::operator&((bitset<100UL> *)in_stack_fffffffffffff148,(bitset<100UL> *)0x2b600f);
          local_728._M_w =
               (_WordT  [2])
               std::operator&((bitset<100UL> *)in_stack_fffffffffffff148,(bitset<100UL> *)0x2b6034);
          local_dda = std::bitset<100UL>::none((bitset<100UL> *)0x2b6051);
        }
        local_dd9 = local_dda;
      }
    }
    if (local_dd9 == false) {
      if (in_R9 == *(size_type *)(*(long *)(in_RDI + 0xb0) + in_RCX * 8)) {
        pvVar6 = std::
                 vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ::operator[]((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                               *)in_stack_00000008,local_348);
        pvVar8 = std::
                 vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ::operator[](local_c0,local_348);
        std::pair<unsigned_long,_unsigned_long>::operator=(pvVar8,pvVar6);
      }
      else {
        sVar9 = in_R9 + 1;
        sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_58);
        if (sVar9 == sVar10) {
          std::operator<<((ostream *)&std::cerr,
                          "WE HAVE A PRODUCT THAT DOES NOT OCCUR AT THE LOWEST LEVEL!?");
          exit(1);
        }
      }
    }
    else {
      ProductAggregate::ProductAggregate((ProductAggregate *)in_stack_fffffffffffff160);
      memcpy(local_838,local_1b8,0xc0);
      std::
      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::operator=(in_stack_fffffffffffff1f0,
                  (vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   *)in_stack_fffffffffffff1e8);
      if (*(ulong *)(*(long *)(in_RDI + 0xb0) + in_RCX * 8) < in_R9) {
LAB_002b6171:
        local_850 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_58);
        local_854 = 0;
        std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_int,_true>
                  (&local_848,&local_850,&local_854);
        std::pair<unsigned_long,_unsigned_long>::operator=(local_760,&local_848);
      }
      else {
        in_stack_fffffffffffff210 = *(bitset<1500UL> **)(*(long *)(in_RDI + 0xb0) + in_RCX * 8);
        pbVar3 = (bitset<1500UL> *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_58);
        if (in_stack_fffffffffffff210 == pbVar3) goto LAB_002b6171;
        pvVar6 = std::
                 vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ::operator[]((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                               *)in_stack_00000008,local_348);
        std::pair<unsigned_long,_unsigned_long>::operator=(local_760,pvVar6);
      }
      sVar9 = in_R9 + 1;
      sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_58);
      local_df1 = false;
      if (sVar9 == sVar10) {
        local_878._M_w =
             (_WordT  [2])
             std::operator&((bitset<100UL> *)in_stack_fffffffffffff148,(bitset<100UL> *)0x2b621b);
        local_868._M_w =
             (_WordT  [2])
             std::operator&((bitset<100UL> *)in_stack_fffffffffffff148,(bitset<100UL> *)0x2b6240);
        local_df1 = std::bitset<100UL>::none((bitset<100UL> *)0x2b625d);
      }
      local_740 = local_df1 != false;
      std::
      vector<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>,_std::allocator<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>_>_>
      ::operator[]((vector<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>,_std::allocator<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>_>_>
                    *)(in_RDI + 0x358),in_R9);
      local_880._M_cur =
           (__node_type *)
           std::
           unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>
           ::find((unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>
                   *)in_stack_fffffffffffff148,(key_type *)0x2b62af);
      std::
      vector<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>,_std::allocator<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>_>_>
      ::operator[]((vector<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>,_std::allocator<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>_>_>
                    *)(in_RDI + 0x358),in_R9);
      local_888._M_cur =
           (__node_type *)
           std::
           unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>
           ::end((unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>
                  *)in_stack_fffffffffffff148);
      bVar2 = std::__detail::operator!=(&local_880,&local_888);
      if (bVar2) {
        ppVar7 = std::__detail::
                 _Node_iterator<std::pair<const_ProductAggregate,_unsigned_long>,_false,_true>::
                 operator->((_Node_iterator<std::pair<const_ProductAggregate,_unsigned_long>,_false,_true>
                             *)0x2b631d);
        std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_true>
                  (&local_898,(unsigned_long *)&stack0xffffffffffffffd0,&ppVar7->second);
        pvVar6 = std::
                 vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ::operator[](local_c0,local_348);
        std::pair<unsigned_long,_unsigned_long>::operator=(pvVar6,&local_898);
      }
      else {
        this_00 = std::
                  vector<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
                  ::operator[]((vector<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
                                *)(in_RDI + 0x370),in_R9);
        in_stack_fffffffffffff1e8 =
             (pointer)std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>::size
                                (this_00);
        local_8a0 = in_stack_fffffffffffff1e8;
        std::
        vector<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>,_std::allocator<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>_>_>
        ::operator[]((vector<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>,_std::allocator<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>_>_>
                      *)(in_RDI + 0x358),in_R9);
        in_stack_fffffffffffff1f0 =
             (vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              *)std::
                unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>
                ::operator[]((unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>
                              *)in_stack_fffffffffffff150,in_stack_fffffffffffff148);
        (in_stack_fffffffffffff1f0->
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        )._M_impl.super__Vector_impl_data._M_start = in_stack_fffffffffffff1e8;
        std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_true>
                  (&local_8b0,(unsigned_long *)&stack0xffffffffffffffd0,(unsigned_long *)&local_8a0)
        ;
        pvVar6 = std::
                 vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ::operator[](local_c0,local_348);
        std::pair<unsigned_long,_unsigned_long>::operator=(pvVar6,&local_8b0);
        std::
        vector<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
        ::operator[]((vector<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
                      *)(in_RDI + 0x370),in_R9);
        std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>::push_back
                  ((vector<ProductAggregate,_std::allocator<ProductAggregate>_> *)
                   in_stack_fffffffffffff160,in_stack_fffffffffffff158);
      }
      pvVar6 = std::
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ::operator[](local_c0,local_348);
      pvVar8 = std::
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ::operator[]((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                             *)in_stack_00000008,local_348);
      std::pair<unsigned_long,_unsigned_long>::operator=(pvVar8,pvVar6);
      ProductAggregate::~ProductAggregate((ProductAggregate *)0x2b64b2);
    }
  }
  sVar9 = in_R9;
  sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_58);
  if (in_R9 == sVar10 - 1) {
    for (local_8b8 = 0; local_8b8 < local_68; local_8b8 = local_8b8 + 1) {
      local_8d0 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_58);
      local_8d4 = 0;
      std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_int,_true>
                (&local_8c8,&local_8d0,&local_8d4);
      pvVar6 = std::
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ::operator[]((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                             *)in_stack_00000008,local_8b8);
      std::pair<unsigned_long,_unsigned_long>::operator=(pvVar6,&local_8c8);
    }
  }
  else {
    in_stack_fffffffffffff148 = in_stack_00000008;
    registerAggregatesToVariables(in_RSI,in_RDX,in_RCX,in_R8,sVar9,(size_t)this_02,unaff_retaddr);
  }
  if (*(ulong *)(*(long *)(in_RDI + 0xb0) + in_RCX * 8) < sVar9) {
LAB_002b670f:
    for (local_8e0 = 0; local_8e0 < local_68; local_8e0 = local_8e0 + 1) {
      pvVar6 = std::
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ::operator[](local_c0,local_8e0);
      uVar1 = pvVar6->first;
      sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_58);
      if (uVar1 < sVar10) {
LAB_002b67a3:
        PostAggRegTuple::PostAggRegTuple((PostAggRegTuple *)in_stack_fffffffffffff160);
        pvVar6 = std::
                 vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ::operator[](local_c0,local_8e0);
        std::pair<unsigned_long,_unsigned_long>::operator=(&local_900,pvVar6);
        pvVar6 = std::
                 vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ::operator[]((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                               *)in_stack_00000008,local_8e0);
        std::pair<unsigned_long,_unsigned_long>::operator=(&local_8f0,pvVar6);
        std::
        vector<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>_>_>
        ::operator[]((vector<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>_>_>
                      *)(in_RDI + 0x448),sVar9);
        local_908._M_cur =
             (__node_type *)
             std::
             unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>
             ::find((unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>
                     *)in_stack_fffffffffffff148,(key_type *)0x2b682c);
        std::
        vector<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>_>_>
        ::operator[]((vector<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>_>_>
                      *)(in_RDI + 0x448),sVar9);
        local_910._M_cur =
             (__node_type *)
             std::
             unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>
             ::end((unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>
                    *)in_stack_fffffffffffff148);
        bVar2 = std::__detail::operator!=(&local_908,&local_910);
        if (bVar2) {
          ppVar12 = std::__detail::
                    _Node_iterator<std::pair<const_PostAggRegTuple,_unsigned_long>,_false,_true>::
                    operator->((_Node_iterator<std::pair<const_PostAggRegTuple,_unsigned_long>,_false,_true>
                                *)0x2b6894);
          std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_true>
                    (&local_920,(unsigned_long *)&stack0xffffffffffffffd0,&ppVar12->second);
          pvVar6 = std::
                   vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ::operator[]((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                 *)in_stack_00000008,local_8e0);
          std::pair<unsigned_long,_unsigned_long>::operator=(pvVar6,&local_920);
        }
        else {
          this_01 = std::
                    vector<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>,_std::allocator<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>_>_>
                    ::operator[]((vector<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>,_std::allocator<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>_>_>
                                  *)(in_RDI + 0x460),sVar9);
          sVar10 = std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>::size(this_01);
          local_928 = sVar10;
          std::
          vector<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>_>_>
          ::operator[]((vector<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>_>_>
                        *)(in_RDI + 0x448),sVar9);
          pmVar13 = std::
                    unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>
                    ::operator[]((unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>
                                  *)in_stack_fffffffffffff150,(key_type *)in_stack_fffffffffffff148)
          ;
          *pmVar13 = sVar10;
          std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_true>
                    (&local_938,(unsigned_long *)&stack0xffffffffffffffd0,&local_928);
          pvVar6 = std::
                   vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ::operator[]((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                 *)in_stack_00000008,local_8e0);
          std::pair<unsigned_long,_unsigned_long>::operator=(pvVar6,&local_938);
          std::
          vector<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>,_std::allocator<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>_>_>
          ::operator[]((vector<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>,_std::allocator<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>_>_>
                        *)(in_RDI + 0x460),sVar9);
          std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>::push_back
                    ((vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_> *)
                     in_stack_fffffffffffff160,(value_type *)in_stack_fffffffffffff158);
        }
      }
      else {
        pvVar6 = std::
                 vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ::operator[]((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                               *)in_stack_00000008,local_8e0);
        uVar1 = pvVar6->first;
        sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_58);
        if (uVar1 < sVar10) goto LAB_002b67a3;
        sVar10 = sVar9 + 1;
        sVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_58);
        if (sVar10 != sVar11) {
          std::operator<<((ostream *)&std::cerr,"ERROR ERROR ERROR - postAggregate is empty ");
          std::operator<<((ostream *)&std::cerr,"we would expect it to contain something || ");
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,sVar9);
          poVar4 = std::operator<<(poVar4," : ");
          sVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_58);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar9);
          poVar4 = std::operator<<(poVar4,"  ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_8e0);
          std::operator<<(poVar4,"\n");
          exit(1);
        }
      }
    }
  }
  else {
    sVar10 = *(size_type *)(*(long *)(in_RDI + 0xb0) + in_RCX * 8);
    sVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_58);
    if (sVar10 == sVar11) goto LAB_002b670f;
  }
  if (sVar9 != *(ulong *)(*(long *)(in_RDI + 0xb0) + in_RCX * 8)) {
    if (sVar9 != 0) goto LAB_002b6e8d;
    in_stack_fffffffffffff160 = *(AggregateTuple **)(*(long *)(in_RDI + 0xb0) + in_RCX * 8);
    pAVar14 = (AggregateTuple *)
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_58);
    if (in_stack_fffffffffffff160 != pAVar14) goto LAB_002b6e8d;
  }
  for (local_940 = 0; local_940 < local_68; local_940 = local_940 + 1) {
    __x = (value_type *)(in_RDI + 0x538);
    local_948 = std::vector<DependentComputation,_std::allocator<DependentComputation>_>::operator[]
                          ((vector<DependentComputation,_std::allocator<DependentComputation>_> *)
                           __x,local_940);
    pvVar15 = std::vector<DependentComputation,_std::allocator<DependentComputation>_>::operator[]
                        ((vector<DependentComputation,_std::allocator<DependentComputation>_> *)__x,
                         local_940);
    local_950 = &pvVar15->view;
    ProductAggregate::ProductAggregate((ProductAggregate *)in_stack_fffffffffffff160);
    memcpy(local_a50,local_948,0xc0);
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::operator=(in_stack_fffffffffffff1f0,
                (vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 *)in_stack_fffffffffffff1e8);
    local_a68 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_58);
    local_a6c = 0;
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_int,_true>
              (&local_a60,&local_a68,&local_a6c);
    std::pair<unsigned_long,_unsigned_long>::operator=(local_978,&local_a60);
    AggregateTuple::AggregateTuple(in_stack_fffffffffffff160);
    pAVar14 = *(AggregateTuple **)(*(long *)(in_RDI + 0xb0) + in_RCX * 8);
    pAVar16 = (AggregateTuple *)
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_58);
    if (pAVar14 == pAVar16) {
      local_cc0 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_58);
      local_cc4 = 0;
      std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_int,_true>
                (local_cb8,&local_cc0,&local_cc4);
      std::pair<unsigned_long,_unsigned_long>::operator=(&local_c98,local_cb8);
    }
    else {
      pvVar6 = std::
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ::operator[](local_c0,local_940);
      std::pair<unsigned_long,_unsigned_long>::operator=(&local_c98,pvVar6);
    }
    pvVar6 = std::
             vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ::operator[]((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                           *)in_stack_00000008,local_940);
    std::pair<unsigned_long,_unsigned_long>::operator=(local_c88,pvVar6);
    std::vector<DependentComputation,_std::allocator<DependentComputation>_>::operator[]
              ((vector<DependentComputation,_std::allocator<DependentComputation>_> *)
               (in_RDI + 0x538),local_940);
    DependentComputation::operator=
              ((DependentComputation *)pAVar14,(DependentComputation *)in_stack_fffffffffffff148);
    ProductAggregate::operator=((ProductAggregate *)pAVar14,in_stack_fffffffffffff148);
    bVar2 = std::bitset<1500UL>::any((bitset<1500UL> *)0x2b6dfe);
    if (bVar2) {
LAB_002b6e13:
      local_b78 = 1;
    }
    else {
      bVar2 = std::
              vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ::empty((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       *)in_stack_fffffffffffff160);
      if (!bVar2) goto LAB_002b6e13;
    }
    std::
    vector<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
    ::operator[]((vector<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
                  *)(in_RDI + 0x520),in_RCX);
    std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>::push_back
              ((vector<AggregateTuple,_std::allocator<AggregateTuple>_> *)in_stack_fffffffffffff160,
               __x);
    AggregateTuple::~AggregateTuple(pAVar14);
    ProductAggregate::~ProductAggregate((ProductAggregate *)0x2b6e63);
  }
LAB_002b6e8d:
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             *)in_stack_fffffffffffff160);
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             *)in_stack_fffffffffffff160);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2b6eb4);
  return;
}

Assistant:

void CppGenerator::registerAggregatesToVariables(
    Aggregate* aggregate, const size_t group_id,
    const size_t view_id, const size_t agg_id, const size_t depth,
    std::vector<std::pair<size_t, size_t>>& localAggReg)
{
    std::vector<std::pair<size_t,size_t>>& incoming = aggregate->_incoming;

    View* view = _qc->getView(view_id);
    TDNode* node = _td->getRelation(view->_origin);
    const var_bitset& relationBag = node->_bag;
    
    const std::vector<size_t>& varOrder = groupVariableOrder[group_id];
    const var_bitset& varOrderBitset = groupVariableOrderBitset[group_id];
    
    const size_t numLocalProducts = aggregate->_agg.size();
    const size_t numberIncomingViews =
        (view->_origin == view->_destination ? node->_numOfNeighbors :
         node->_numOfNeighbors - 1);
    
    dyn_bitset loopFactors(_qc->numberOfViews()+1);

    std::vector<std::pair<size_t, size_t>>
        localComputation(numLocalProducts, {varOrder.size(), 0});

    std::vector<std::pair<size_t,size_t>> viewReg;
    prod_bitset localFunctions, considered;

    // TODO: we computed this before - perhaps reuse?! 
    // Compute dependent variables on the variables in the head of view:
    var_bitset dependentVariables;
    var_bitset nonVarOrder = view->_fVars & ~varOrderBitset;

    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (nonVarOrder[var])
        {
            // find bag that contains this variable
            if (relationBag[var])
                dependentVariables |= relationBag & ~varOrderBitset;
            else
            {
                // check incoming views
                for (const size_t& incViewID : incomingViews[view_id])
                {
                    View* incView = _qc->getView(incViewID);
                    if (incView->_fVars[var])
                        dependentVariables |= incView->_fVars & ~varOrderBitset;
                }
            }
        }
    }
    
    // go over each product and check if parts of it can be computed at current depth
    size_t incCounter = 0;
    for (size_t prodID = 0; prodID < numLocalProducts; ++prodID)
    {
        prod_bitset &product = aggregate->_agg[prodID];

        considered.reset();
        localFunctions.reset();
        
        for (size_t f = 0; f < NUM_OF_FUNCTIONS; ++f)
        {
            if (product.test(f) && !considered[f])
            {
                Function* function = _qc->getFunction(f);
                considered.set(f);
                
                // check if this function is covered
                if ((function->_fVars & coveredVariables[depth]) == function->_fVars)
                {   
                    // get all variables that this function depends on. 
                    var_bitset dependentFunctionVars;
                    for (size_t var=0; var<NUM_OF_VARIABLES;++var)
                    {
                        if (function->_fVars[var])
                            dependentFunctionVars |= variableDependency[var];
                    }
                    dependentFunctionVars &= ~varOrderBitset;

                    // Find all functions that overlap / depend on this function
                    bool overlaps, computeHere;
                    var_bitset overlapVars;
                    prod_bitset overlapFunc = prod_bitset().set(f);

                    do
                    {
                        overlaps = false;
                        computeHere = true;
                        overlapVars |= function->_fVars;

                        for (size_t f2 = 0; f2 < NUM_OF_FUNCTIONS; ++f2)
                        {
                            if (product[f2] && !considered[f2] && !overlapFunc[f2])
                            {
                                Function* otherFunction = _qc->getFunction(f);
                                const var_bitset& otherFVars = otherFunction->_fVars;
                                // check if functions depend on each other
                                // if ((otherFunction->_fVars & nonVarOrder).any()) 
                                if ((otherFVars & dependentFunctionVars).any())
                                {
                                    considered.set(f2);
                                    overlapFunc.set(f2);
                                    overlaps = true;
                                    overlapVars |= otherFunction->_fVars;
                                    // check if otherFunction is covered
                                    if ((otherFVars & coveredVariables[depth]) !=
                                        otherFVars)
                                    {
                                        // if it is not covered then compute entire
                                        // group at later stage
                                        computeHere = false;
                                    }
                                }
                            }
                        }
                    } while(overlaps && !computeHere);
                                    
                    if (computeHere)
                    {
                        // check if the variables are dependent on vars in head
                        // of outcoming view
                        if (((overlapVars & ~varOrderBitset) & dependentVariables).any())
                        {
                            if (viewLevelRegister[view_id] != depth)
                                ERROR("ERROR ERROR: in dependent computation:"
                                      <<" viewLevelRegister[viewID] != depth\n");
                            
                            dependentComputation[prodID].product |= overlapFunc;
                        }
                        else // add all functions that overlap together at this level!
                            localFunctions |= overlapFunc;

                        // remove overlapping functions from product
                        product &= ~overlapFunc;
                    }
                }
            }
        }
        
        // go over each incoming views and check if their incoming products can
        // be computed at this level. 
        viewReg.clear();

        for (size_t n = 0; n < numberIncomingViews; ++n)
        {
            size_t& incViewID = incoming[incCounter].first;

            if (addableViews[incViewID + (depth * (_qc->numberOfViews()+1))])
            {
                View* incView = _qc->getView(incViewID);

                // TODO: I think the below statement is fine but should we use
                // dependent variables instead?! - here we just check if any of
                // the vars from incView are present in the vars for view
                if (((incView->_fVars & ~varOrderBitset) & view->_fVars).none())
                {
                    viewReg.push_back(incoming[incCounter]);

                    /************** PRINT OUT ****************/
                    // if (group_id == 5 &&  incoming[incCounter].first == 2 &&
                    //     incoming[incCounter].second == 125)
                    // {
                    //     std::cout << "##--------" <<
                    //         incoming[incCounter].first << " - " <<
                    //         incoming[incCounter].second << std::endl;
                    // }
                    /************** PRINT OUT ****************/
                }
                else
                {
                    // if (depth == viewLevelRegister[view_id])
                    // {
                    // std::cout << "This view has an additional variable: "+
                    //     viewName[incViewID]+"\nviewAgg: aggs_"+viewName[incViewID]
                    //     +"-"+" viewLevelReg: "<<viewLevelRegister[view_id]<<
                    //     " depth: " << depth << std::endl;
                    dependentComputation[prodID].view.push_back(
                        incoming[incCounter]);
                    // }
                    // if (depth != viewLevelRegister[view_id])
                    // {
                    //     ERROR(depth << "  " << incViewID << "  " << view_id << " "
                    //           << viewLevelRegister[view_id] << " "+node->_name+" ");
                    //     ERROR(view->_fVars << std::endl);
                    //     ERROR("IS THIS A MISTAKE?!\n");
                    // }       
                }

                // This incoming view will no longer be considered 
                incoming[incCounter].first = _qc->numberOfViews();
            }
            ++incCounter;
        }
        
        // Check if this product has already been computed, if not we add it
        // to the list
        if (localFunctions.any() || !viewReg.empty() ||
            (depth+1 == varOrder.size() &&
                (dependentVariables & relationBag & nonVarOrder).none()))
        {                
            ProductAggregate prodAgg;
            prodAgg.product = localFunctions;
            prodAgg.viewAggregate = viewReg;
            
            if (depth <= viewLevelRegister[view_id] &&
                viewLevelRegister[view_id] != varOrder.size())
            {
                prodAgg.previous = localAggReg[prodID];
            }
            else
                prodAgg.previous = {varOrder.size(), 0};

            if (depth+1 == varOrder.size() &&
                (dependentVariables & relationBag & nonVarOrder).none())
                prodAgg.multiplyByCount = true;
            else
                prodAgg.multiplyByCount = false;
            
            auto prod_it = productToVariableMap[depth].find(prodAgg);
            if (prod_it != productToVariableMap[depth].end())
            {
                // Then update the localAggReg for this product
                localComputation[prodID] = {depth,prod_it->second};                
            }
            else
            {
                size_t newProdID =  productToVariableRegister[depth].size();
                // If so, add it to the aggregate register
                productToVariableMap[depth][prodAgg] = newProdID;
                localComputation[prodID] = {depth,newProdID};
                productToVariableRegister[depth].push_back(prodAgg);                
            }
            
            localAggReg[prodID] = localComputation[prodID];

            /******** PRINT OUT **********/
            // dyn_bitset contribViews(_qc->numberOfViews()+1);
            // for (auto& p : viewReg)
            //     contribViews.set(p.first);
            
            // std::cout << "group_id " << group_id << " depth: " << depth << std::endl;
            // std::cout << genProductString(*node, contribViews, localFunctions)
            //           << std::endl;
            /******** PRINT OUT **********/
        }    
        // if we didn't set a new computation - check if this level is the view Level:
        else if (depth == viewLevelRegister[view_id])
        {
            // Add the previous aggregate to local computation
            localComputation[prodID] = localAggReg[prodID];
            // TODO: (CONSIDER) think about keeping this separate as above
        }
        else if (depth+1 == varOrder.size())
        {
            ERROR("WE HAVE A PRODUCT THAT DOES NOT OCCUR AT THE LOWEST LEVEL!?");
            exit(1);
        }
    }
    
    // recurse to next depth ! 
    if (depth != varOrder.size()-1)
    {
        registerAggregatesToVariables(
            aggregate,group_id,view_id,agg_id,depth+1,localAggReg);
    }
    else
    {
        // resetting aggRegisters !        
        for (size_t i = 0; i < numLocalProducts; ++i)
            localAggReg[i] = {varOrder.size(),0};
    }
    
    if (depth > viewLevelRegister[view_id] ||
        viewLevelRegister[view_id] == varOrder.size())
    {
        // now adding aggregates coming from below to running sum
        for (size_t prodID = 0; prodID < numLocalProducts; ++prodID)
        {
            if (localComputation[prodID].first < varOrder.size() ||
                localAggReg[prodID].first < varOrder.size())
            {
                PostAggRegTuple postTuple;                
                postTuple.local = localComputation[prodID];
                postTuple.post = localAggReg[prodID];

                auto postit = postRegisterMap[depth].find(postTuple);
                if (postit != postRegisterMap[depth].end())
                {
                    localAggReg[prodID] = {depth,postit->second};
                }
                else
                {
                    size_t postProdID = postRegisterList[depth].size();
                    postRegisterMap[depth][postTuple] = postProdID;
                    localAggReg[prodID] = {depth, postProdID};
                    postRegisterList[depth].push_back(postTuple);
                }
            }
            else if (depth+1 != varOrder.size())
            {
                ERROR("ERROR ERROR ERROR - postAggregate is empty ");
                ERROR("we would expect it to contain something || ");
                ERROR(depth << " : " << varOrder.size()<< "  " << prodID << "\n");
                exit(1);
            }
        }
    }
    
    if (depth == viewLevelRegister[view_id] || 
        (depth == 0 && viewLevelRegister[view_id] == varOrder.size()))
    {
        // We now add both components to the respecitve registers
        // std::pair<bool,size_t> regTupleProduct;
        // std::pair<bool,size_t> regTupleView;

        // now adding aggregates to final computation 
        for (size_t prodID = 0; prodID < numLocalProducts; ++prodID)
        {
            // TODO: Why not avoid this loop and put the vectors into the
            // AggregateTuple
            // This is then one aggregateTuple for one specific Aggregate for
            // this view
            // THen add this aggregate to the specific view and not to depth
            
            const prod_bitset&  dependentFunctions =
                dependentComputation[prodID].product;
            const std::vector<std::pair<size_t,size_t>>& dependentViewReg =
                dependentComputation[prodID].view;

            ProductAggregate prodAgg;
            prodAgg.product = dependentFunctions;
            prodAgg.viewAggregate = dependentViewReg;
            prodAgg.previous = {varOrder.size(), 0};
            
            AggregateTuple aggComputation;
            aggComputation.viewID = view_id;
            aggComputation.aggID = agg_id;
            if (viewLevelRegister[view_id] != varOrder.size()) 
                aggComputation.local = localComputation[prodID];
            else
                 aggComputation.local = {varOrder.size(), 0};
            aggComputation.post = localAggReg[prodID];
            aggComputation.dependentComputation = dependentComputation[prodID];
            aggComputation.dependentProdAgg = prodAgg;

            if (dependentFunctions.any() || !dependentViewReg.empty())
                aggComputation.hasDependentComputation = true;
            
            // if (dependentFunctions.any() || !dependentViewReg.empty())
            // {                
            //     ProductAggregate prodAgg;
            //     prodAgg.product = dependentFunctions;
            //     prodAgg.viewAggregate = dependentViewReg;
            //     prodAgg.previous = {varOrder.size(), 0};
            //     auto prod_it = productToVariableMap[depDepth].find(prodAgg);
            //     if (prod_it != productToVariableMap[depDepth].end())
            //     {
            //         // Then update the localAggReg for this product
            //         aggComputation.dependentProduct = {depDepth,prod_it->second};
            //     }
            //     else
            //     {
            //         // If so, add it to the aggregate register
            //         size_t newProdID = productToVariableRegister[depDepth].size();
            //         productToVariableMap[depDepth][prodAgg] = newProdID;
            //         aggComputation.dependentProduct = {depDepth,newProdID};
            //         productToVariableRegister[depDepth].push_back(prodAgg);
            //     }
            // }
            // else
            // {
            //     aggComputation.dependentProduct = {varOrder.size(), 0};
            // }
            
            aggregateComputation[view_id].push_back(aggComputation);
        }
    }
}